

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberSymbols.cpp
# Opt level: O0

Symbol * __thiscall slang::ast::ExplicitImportSymbol::importedSymbol(ExplicitImportSymbol *this)

{
  bool bVar1;
  SyntaxNode *pSVar2;
  PackageImportItemSyntax *pPVar3;
  PackageSymbol *pPVar4;
  Symbol *pSVar5;
  Diagnostic *pDVar6;
  SourceLocation in_R8;
  string_view packageName;
  Symbol *sym;
  Diagnostic *diag;
  SyntaxNode *syntax_1;
  SyntaxNode *syntax;
  SourceLocation loc;
  Scope *scope;
  ExplicitImportSymbol *this_local;
  
  if ((this->initialized & 1U) == 0) {
    this->initialized = true;
    loc = (SourceLocation)Symbol::getParentScope(&this->super_Symbol);
    if (loc == (SourceLocation)0x0) {
      assert::assertFailed
                ("scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/symbols/MemberSymbols.cpp"
                 ,0x50,"const Symbol *slang::ast::ExplicitImportSymbol::importedSymbol() const");
    }
    syntax = *(SyntaxNode **)&(this->super_Symbol).location;
    pSVar2 = Symbol::getSyntax(&this->super_Symbol);
    if (pSVar2 != (SyntaxNode *)0x0) {
      pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::PackageImportItemSyntax>(pSVar2);
      syntax = (SyntaxNode *)parsing::Token::location(&pPVar3->package);
    }
    packageName._M_str = (char *)loc;
    packageName._M_len = (size_t)(this->packageName)._M_str;
    pPVar4 = findPackage((ast *)(this->packageName)._M_len,packageName,(Scope *)syntax,in_R8);
    this->package_ = pPVar4;
    if (this->package_ == (PackageSymbol *)0x0) {
      return (Symbol *)0x0;
    }
    pSVar5 = PackageSymbol::findForImport(this->package_,this->importName);
    this->import = pSVar5;
    if (this->import == (Symbol *)0x0) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&this->importName);
      if (!bVar1) {
        syntax = *(SyntaxNode **)&(this->super_Symbol).location;
        pSVar2 = Symbol::getSyntax(&this->super_Symbol);
        if (pSVar2 != (SyntaxNode *)0x0) {
          pPVar3 = slang::syntax::SyntaxNode::as<slang::syntax::PackageImportItemSyntax>(pSVar2);
          syntax = (SyntaxNode *)parsing::Token::location(&pPVar3->item);
        }
        pDVar6 = Scope::addDiag((Scope *)loc,(DiagCode)0x34000a,(SourceLocation)syntax);
        pDVar6 = Diagnostic::operator<<(pDVar6,this->importName);
        Diagnostic::operator<<(pDVar6,(this->super_Symbol).name);
      }
    }
    else {
      do {
        pSVar5 = Scope::asSymbol((Scope *)loc);
        if (pSVar5->kind == Package) {
          pPVar4 = Symbol::as<slang::ast::PackageSymbol>(pSVar5);
          PackageSymbol::noteImport(pPVar4,this->import);
          break;
        }
        loc = (SourceLocation)Symbol::getParentScope(pSVar5);
      } while (loc != (SourceLocation)0x0);
    }
  }
  return this->import;
}

Assistant:

const Symbol* ExplicitImportSymbol::importedSymbol() const {
    if (!initialized) {
        initialized = true;

        const Scope* scope = getParentScope();
        ASSERT(scope);

        auto loc = location;
        if (auto syntax = getSyntax())
            loc = syntax->as<PackageImportItemSyntax>().package.location();

        package_ = findPackage(packageName, *scope, loc);
        if (!package_)
            return nullptr;

        import = package_->findForImport(importName);
        if (!import) {
            if (!importName.empty()) {
                loc = location;
                if (auto syntax = getSyntax())
                    loc = syntax->as<PackageImportItemSyntax>().item.location();

                auto& diag = scope->addDiag(diag::UnknownPackageMember, loc);
                diag << importName << name;
            }
        }
        else {
            // If we are doing this lookup from a scope that is within a package declaration
            // we should note that fact so that it can later be exported if desired.
            do {
                auto& sym = scope->asSymbol();
                if (sym.kind == SymbolKind::Package) {
                    sym.as<PackageSymbol>().noteImport(*import);
                    break;
                }

                scope = sym.getParentScope();
            } while (scope);
        }
    }
    return import;
}